

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Gia_ManBmcAddCone(Bmc_Mna_t *p,int iStart,int iStop)

{
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  p->vNodes->nSize = 0;
  p->vInputs->nSize = 0;
  p->vOutputs->nSize = 0;
  Vec_IntFillExtra(p->vId2Var,p->pFrames->nObjs,iStop);
  for (; iStart < iStop; iStart = iStart + 1) {
    pGVar4 = Gia_ManPo(p->pFrames,iStart);
    if (p->pFrames->pObjs !=
        (Gia_Obj_t *)
        ((ulong)((uint)*(undefined8 *)pGVar4 >> 0x1d & 1) ^
        (ulong)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)))) {
      Gia_ManBmcAddCone_rec(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      p_00 = p->vOutputs;
      iVar2 = Gia_ObjId(p->pFrames,pGVar4);
      Vec_IntPush(p_00,iVar2);
    }
  }
  for (iVar2 = 0; iVar2 < p->vNodes->nSize; iVar2 = iVar2 + 1) {
    pGVar1 = p->pFrames;
    iVar3 = Vec_IntEntry(p->vNodes,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
  }
  iVar2 = 0;
  while( true ) {
    if (p->vInputs->nSize <= iVar2) {
      return;
    }
    pGVar1 = p->pFrames;
    iVar3 = Vec_IntEntry(p->vInputs,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void Gia_ManBmcAddCone( Bmc_Mna_t * p, int iStart, int iStop )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vInputs );
    Vec_IntClear( p->vOutputs );
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    for ( i = iStart; i < iStop; i++ )
    {
        pObj = Gia_ManPo(p->pFrames, i);
        if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
            continue;
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Vec_IntPush( p->vOutputs, Gia_ObjId(p->pFrames, pObj) );
    }
    // clean attributes and create new variables
    Gia_ManForEachObjVec( p->vNodes, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachObjVec( p->vInputs, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
}